

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * ODDLParser::OpenDDLParser::parseIntegerLiteral
                 (char *in,char *end,Value **integer,ValueType integerType)

{
  char *pcVar1;
  bool bVar2;
  char *__nptr;
  longlong value;
  ulonglong value_00;
  Value *this;
  char *pcVar3;
  
  *integer = (Value *)0x0;
  if ((uint)(integerType + ddl_none) < 8 && (in != end && in != (char *)0x0)) {
    pcVar3 = end;
    __nptr = lookForNextToken<char>(in,end);
    pcVar1 = __nptr;
    do {
      in = pcVar1;
      bVar2 = isSeparator<char>((ODDLParser *)(ulong)(uint)(int)*in,(char)pcVar3);
      if (in == end) break;
      pcVar1 = in + 1;
    } while (!bVar2);
    if ((byte)(*__nptr - 0x30U) < 10) {
      value = atoll(__nptr);
      value_00 = strtoull(__nptr,(char **)0x0,10);
      this = ValueAllocator::allocPrimData(integerType,1);
      *integer = this;
      switch(integerType + ddl_none) {
      case ddl_bool:
        Value::setInt8(this,(int8)value);
        break;
      case ddl_int8:
        Value::setInt16(this,(int16)value);
        break;
      case ddl_int16:
        Value::setInt32(this,(int32)value);
        break;
      case ddl_int32:
        Value::setInt64(this,value);
        break;
      case ddl_int64:
        Value::setUnsignedInt8(this,(uint8)value_00);
        break;
      case ddl_unsigned_int8:
        Value::setUnsignedInt16(this,(uint16)value_00);
        break;
      case ddl_unsigned_int16:
        Value::setUnsignedInt32(this,(uint32)value_00);
        break;
      case ddl_unsigned_int32:
        Value::setUnsignedInt64(this,value_00);
      }
    }
  }
  return in;
}

Assistant:

char *OpenDDLParser::parseIntegerLiteral( char *in, char *end, Value **integer, Value::ValueType integerType ) {
    *integer = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    if( !(isIntegerType( integerType ) || isUnsignedIntegerType(integerType)) ) {
        return in;
    }

    in = lookForNextToken( in, end );
    char *start( in );
    while( !isSeparator( *in ) && in != end ) {
        ++in;
    }

    if( isNumeric( *start ) ) {
#ifdef OPENDDL_NO_USE_CPP11
        const int64 value( atol( start ) ); // maybe not really 64bit as atoll is but exists without c++11
        const uint64 uvalue( strtoul( start,ddl_nullptr,10 ) );
#else
        const int64 value( atoll( start ) );
        const uint64 uvalue( strtoull( start,ddl_nullptr,10 ) );
#endif
        *integer = ValueAllocator::allocPrimData( integerType );
        switch( integerType ) {
            case Value::ddl_int8:
                ( *integer )->setInt8( (int8) value );
                break;
            case Value::ddl_int16:
                ( *integer )->setInt16( ( int16 ) value );
                break;
            case Value::ddl_int32:
                ( *integer )->setInt32( ( int32 ) value );
                break;
            case Value::ddl_int64:
                ( *integer )->setInt64( ( int64 ) value );
                break;
            case Value::ddl_unsigned_int8:
                ( *integer )->setUnsignedInt8( (uint8) uvalue );
                break;
            case Value::ddl_unsigned_int16:
                ( *integer )->setUnsignedInt16( ( uint16 ) uvalue );
                break;
            case Value::ddl_unsigned_int32:
                ( *integer )->setUnsignedInt32( ( uint32 ) uvalue );
                break;
            case Value::ddl_unsigned_int64:
                ( *integer )->setUnsignedInt64( ( uint64 ) uvalue );
                break;
            default:
                break;
        }
    }

    return in;
}